

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.cc
# Opt level: O0

void __thiscall AddrSpaceManager::~AddrSpaceManager(AddrSpaceManager *this)

{
  AddrSpace *pAVar1;
  JoinRecord *this_00;
  bool bVar2;
  reference ppAVar3;
  size_type sVar4;
  reference ppAVar5;
  reference ppJVar6;
  int local_30;
  int local_2c;
  int4 i_1;
  int4 i;
  AddrSpace *spc;
  __normal_iterator<AddrSpace_**,_std::vector<AddrSpace_*,_std::allocator<AddrSpace_*>_>_> local_18;
  iterator iter;
  AddrSpaceManager *this_local;
  
  this->_vptr_AddrSpaceManager = (_func_int **)&PTR__AddrSpaceManager_00849048;
  iter._M_current = (AddrSpace **)this;
  local_18._M_current =
       (AddrSpace **)std::vector<AddrSpace_*,_std::allocator<AddrSpace_*>_>::begin(&this->baselist);
  while( true ) {
    spc = (AddrSpace *)std::vector<AddrSpace_*,_std::allocator<AddrSpace_*>_>::end(&this->baselist);
    bVar2 = __gnu_cxx::operator!=
                      (&local_18,
                       (__normal_iterator<AddrSpace_**,_std::vector<AddrSpace_*,_std::allocator<AddrSpace_*>_>_>
                        *)&spc);
    if (!bVar2) break;
    ppAVar3 = __gnu_cxx::
              __normal_iterator<AddrSpace_**,_std::vector<AddrSpace_*,_std::allocator<AddrSpace_*>_>_>
              ::operator*(&local_18);
    pAVar1 = *ppAVar3;
    if (pAVar1 != (AddrSpace *)0x0) {
      if (pAVar1->refcount < 2) {
        if (pAVar1 != (AddrSpace *)0x0) {
          (*pAVar1->_vptr_AddrSpace[1])();
        }
      }
      else {
        pAVar1->refcount = pAVar1->refcount + -1;
      }
    }
    __gnu_cxx::
    __normal_iterator<AddrSpace_**,_std::vector<AddrSpace_*,_std::allocator<AddrSpace_*>_>_>::
    operator++(&local_18);
  }
  for (local_2c = 0;
      sVar4 = std::vector<AddressResolver_*,_std::allocator<AddressResolver_*>_>::size
                        (&this->resolvelist), (ulong)(long)local_2c < sVar4; local_2c = local_2c + 1
      ) {
    ppAVar5 = std::vector<AddressResolver_*,_std::allocator<AddressResolver_*>_>::operator[]
                        (&this->resolvelist,(long)local_2c);
    if (*ppAVar5 != (value_type)0x0) {
      ppAVar5 = std::vector<AddressResolver_*,_std::allocator<AddressResolver_*>_>::operator[]
                          (&this->resolvelist,(long)local_2c);
      if (*ppAVar5 != (value_type)0x0) {
        (*(*ppAVar5)->_vptr_AddressResolver[1])();
      }
    }
  }
  for (local_30 = 0;
      sVar4 = std::vector<JoinRecord_*,_std::allocator<JoinRecord_*>_>::size(&this->splitlist),
      (ulong)(long)local_30 < sVar4; local_30 = local_30 + 1) {
    ppJVar6 = std::vector<JoinRecord_*,_std::allocator<JoinRecord_*>_>::operator[]
                        (&this->splitlist,(long)local_30);
    this_00 = *ppJVar6;
    if (this_00 != (JoinRecord *)0x0) {
      JoinRecord::~JoinRecord(this_00);
      operator_delete(this_00);
    }
  }
  std::vector<JoinRecord_*,_std::allocator<JoinRecord_*>_>::~vector(&this->splitlist);
  std::set<JoinRecord_*,_JoinRecordCompare,_std::allocator<JoinRecord_*>_>::~set(&this->splitset);
  std::map<int,_AddrSpace_*,_std::less<int>,_std::allocator<std::pair<const_int,_AddrSpace_*>_>_>::
  ~map(&this->shortcut2Space);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AddrSpace_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AddrSpace_*>_>_>
  ::~map(&this->name2Space);
  std::vector<AddressResolver_*,_std::allocator<AddressResolver_*>_>::~vector(&this->resolvelist);
  std::vector<AddrSpace_*,_std::allocator<AddrSpace_*>_>::~vector(&this->baselist);
  return;
}

Assistant:

AddrSpaceManager::~AddrSpaceManager(void)

{
  for(vector<AddrSpace *>::iterator iter=baselist.begin();iter!=baselist.end();++iter) {
    AddrSpace *spc = *iter;
    if (spc == (AddrSpace *)0) continue;
    if (spc->refcount > 1)
      spc->refcount -= 1;
    else
      delete spc;
  }
  for(int4 i=0;i<resolvelist.size();++i) {
    if (resolvelist[i] != (AddressResolver *)0)
      delete resolvelist[i];
  }
  for(int4 i=0;i<splitlist.size();++i)
    delete splitlist[i];	// Delete any join records
}